

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O2

char16 * Js::NarrowStringToWide(Context *ctx,char *src,size_t *srcSize,charcount_t *dstSize)

{
  ulong count;
  HRESULT HVar1;
  undefined8 in_RAX;
  size_t sourceCount;
  char16_t *destString;
  charcount_t local_34 [2];
  charcount_t size;
  
  local_34[0] = (charcount_t)((ulong)in_RAX >> 0x20);
  if (srcSize == (size_t *)0x0) {
    sourceCount = strlen(src);
  }
  else {
    sourceCount = *srcSize;
  }
  count = sourceCount * 2 + 2;
  if (sourceCount <= count) {
    destString = Memory::AllocateArray<Memory::ArenaAllocator,char16_t,false>
                           ((Memory *)ctx->allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc
                            ,0,count);
    if (destString != (char16_t *)0x0) {
      HVar1 = utf8::NarrowStringToWideNoAlloc(src,sourceCount,destString,sourceCount + 1,local_34);
      if (HVar1 == 0) {
        if (dstSize != (charcount_t *)0x0) {
          *dstSize = local_34[0];
        }
        return destString;
      }
    }
  }
  JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
}

Assistant:

char16* NarrowStringToWide(Context* ctx, const char* src, const size_t* srcSize = nullptr, charcount_t* dstSize = nullptr)
{
    auto allocator = [&ctx](size_t size) {return (char16*)AnewArray(ctx->allocator, char16, size); };
    char16* dst = nullptr;
    charcount_t size;
    HRESULT hr = utf8::NarrowStringToWide(allocator, src, srcSize ? *srcSize : strlen(src), &dst, &size);
    if (hr != S_OK)
    {
        JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
    }
    if (dstSize)
    {
        *dstSize = size;
    }
    return dst;
}